

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_refract_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float fVar2;
  float res;
  Vector<float,_3> res_3;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  float afStack_68 [6];
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  float local_38 [4];
  undefined8 local_28;
  float local_20 [2];
  ulong local_18;
  undefined4 local_10;
  
  local_38[3] = c->in[0].m_data[2];
  local_28 = *(undefined8 *)c->in[0].m_data;
  local_48 = *(undefined8 *)(c->in[1].m_data + 1);
  local_40 = c->in[1].m_data[0];
  local_4c = c->in[2].m_data[1];
  local_50 = 0.0;
  lVar1 = 0;
  do {
    local_50 = local_50 + *(float *)((long)&local_48 + lVar1 * 4) * local_38[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 1.0 - local_4c * local_4c * (1.0 - local_50 * local_50);
  if (0.0 <= fVar2) {
    local_18 = local_18 & 0xffffffff00000000;
    local_20[0] = 0.0;
    local_20[1] = 0.0;
    lVar1 = 0;
    do {
      local_20[lVar1] = local_38[lVar1 + 3] * local_4c;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    local_38[2] = 0.0;
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    lVar1 = 0;
    do {
      local_38[lVar1] = *(float *)((long)&local_48 + lVar1 * 4) * (local_4c * local_50 + fVar2);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    afStack_68[4] = 0.0;
    afStack_68[2] = 0.0;
    afStack_68[3] = 0.0;
    lVar1 = 0;
    do {
      afStack_68[lVar1 + 2] = local_20[lVar1] - local_38[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
    afStack_68[4] = 0.0;
    afStack_68[2] = 0.0;
    afStack_68[3] = 0.0;
  }
  local_18 = 0x100000000;
  local_10 = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[(int)local_20[lVar1]] = afStack_68[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

void eval_refract_vec3	(ShaderEvalContext& c) { c.color.xyz()	= refract(c.in[0].swizzle(2, 0, 1),    c.in[1].swizzle(1, 2, 0),    c.in[2].y()); }